

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatumFactory.cpp
# Opt level: O0

VRDatumPtr __thiscall
MinVR::VRDatumFactory::CreateVRDatum(VRDatumFactory *this,int VRDatumId,void *pData)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  VRDatumPtrRC *extraout_RDX;
  char *in_RSI;
  VRDatum_conflict *in_RDI;
  VRDatumPtr VVar4;
  string *in_stack_000000d8;
  int *in_stack_000000e0;
  string *in_stack_000000e8;
  string *in_stack_000000f0;
  string *in_stack_000000f8;
  VRError *in_stack_00000100;
  const_iterator it;
  map<int,_MinVR::VRDatumPtr_(*)(void_*),_std::less<int>,_std::allocator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>_>
  *in_stack_fffffffffffffec8;
  VRDatum_conflict *__a;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff17;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_> local_28 [5];
  
  __a = in_RDI;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_MinVR::VRDatumPtr_(*)(void_*),_std::less<int>,_std::allocator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>_>
       ::find(in_stack_fffffffffffffec8,(key_type *)0x166b9d);
  std::_Rb_tree_const_iterator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>::
  _Rb_tree_const_iterator(local_28,&local_30);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<int,_MinVR::VRDatumPtr_(*)(void_*),_std::less<int>,_std::allocator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>_>
       ::end(in_stack_fffffffffffffec8);
  std::_Rb_tree_const_iterator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>::
  _Rb_tree_const_iterator(&local_38,&local_40);
  bVar1 = std::operator==(local_28,&local_38);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_int,_MinVR::VRDatumPtr_(*)(void_*)>_>
                         *)0x166dfd);
    (*ppVar3->second)(in_RDI);
    VVar4.reference = extraout_RDX;
    VVar4.pData = __a;
    return VVar4;
  }
  uVar5 = 1;
  uVar2 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,CONCAT16(uVar5,in_stack_ffffffffffffff10)),in_RSI,
             (allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,CONCAT16(uVar5,in_stack_ffffffffffffff10)),in_RSI,
             (allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,CONCAT16(uVar5,in_stack_ffffffffffffff10)),in_RSI,
             (allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff17,CONCAT16(uVar5,in_stack_ffffffffffffff10)),in_RSI,
             (allocator<char> *)__a);
  VRError::VRError(in_stack_00000100,in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,
                   in_stack_000000e0,in_stack_000000d8);
  __cxa_throw(uVar2,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumPtr VRDatumFactory::CreateVRDatum(int VRDatumId,
                                         void* pData) {
  // try to find the callback corresponding to the given type id;
  // if no id found, throw exception
  CallbackMap::const_iterator it = m_callbacks.find(VRDatumId);
  if (it == m_callbacks.end()) {
    VRERRORNOADV("Unknown VR type ID.");
  } else {
    // create the instance using the creator callback
    return VRDatumPtr((it->second)(static_cast<void *>(pData)));
  }
}